

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWriteLatch(FILE *pFile,Abc_Obj_t *pLatch)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  char *pcVar4;
  int Reset;
  Abc_Obj_t *pNetLo;
  Abc_Obj_t *pNetLi;
  Abc_Obj_t *pLatch_local;
  FILE *pFile_local;
  
  pAVar1 = Abc_ObjFanin0(pLatch);
  pAVar1 = Abc_ObjFanin0(pAVar1);
  pAVar2 = Abc_ObjFanout0(pLatch);
  pAVar2 = Abc_ObjFanout0(pAVar2);
  pvVar3 = Abc_ObjData(pLatch);
  fprintf((FILE *)pFile,".latch");
  pcVar4 = Abc_ObjName(pAVar1);
  fprintf((FILE *)pFile," %10s",pcVar4);
  pcVar4 = Abc_ObjName(pAVar2);
  fprintf((FILE *)pFile," %10s",pcVar4);
  fprintf((FILE *)pFile,"  %d\n",(ulong)((int)pvVar3 - 1));
  return;
}

Assistant:

void Io_NtkWriteLatch( FILE * pFile, Abc_Obj_t * pLatch )
{
    Abc_Obj_t * pNetLi, * pNetLo;
    int Reset;
    pNetLi = Abc_ObjFanin0( Abc_ObjFanin0(pLatch) );
    pNetLo = Abc_ObjFanout0( Abc_ObjFanout0(pLatch) );
    Reset  = (int)(ABC_PTRUINT_T)Abc_ObjData( pLatch );
    // write the latch line
    fprintf( pFile, ".latch" );
    fprintf( pFile, " %10s",    Abc_ObjName(pNetLi) );
    fprintf( pFile, " %10s",    Abc_ObjName(pNetLo) );
    fprintf( pFile, "  %d\n",   Reset-1 );
}